

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

Data * __thiscall Function::eval(Function *this,vector<Data_*,_std::allocator<Data_*>_> *parasData)

{
  pointer ppDVar1;
  Runtime *this_00;
  Data *pDVar2;
  Data **i;
  Function *pFVar3;
  _List_node_base *p_Var4;
  pointer ppDVar5;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  
  this_00 = (Runtime *)operator_new(8);
  Runtime::Runtime(this_00);
  pFVar3 = (Function *)
           (this->paras).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (pFVar3 != this) {
    ppDVar5 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Runtime::assignVarToTop
                (this_00,(string *)
                         &(pFVar3->paras).
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size,*ppDVar5);
      ppDVar5 = ppDVar5 + 1;
      pFVar3 = (Function *)
               (pFVar3->paras).
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    } while (pFVar3 != this);
  }
  for (p_Var4 = (this->body).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var4 != (this->body).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                super__List_node_base._M_prev; p_Var4 = p_Var4->_M_next) {
    pDVar2 = (Data *)(*(code *)(p_Var4[1]._M_next)->_M_next[1]._M_prev)(p_Var4[1]._M_next,this_00);
    Data::check(pDVar2);
  }
  pDVar2 = (Data *)(*(code *)(p_Var4[1]._M_next)->_M_next[1]._M_prev)(p_Var4[1]._M_next,this_00);
  ppDVar5 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppDVar1 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar5 != ppDVar1) {
    do {
      Data::check(*ppDVar5);
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 != ppDVar1);
    ppDVar5 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppDVar5 != (pointer)0x0) {
    operator_delete(ppDVar5);
  }
  operator_delete(parasData);
  Runtime::~Runtime(this_00);
  operator_delete(this_00);
  return pDVar2;
}

Assistant:

Data *Function::eval(std::vector<Data *> *parasData) {
    Data *result;
    auto runtime = new Runtime();
    auto parasCursor = paras.begin();
    auto parasDataCursor = parasData->begin();
    while (parasCursor != paras.end()) {
        runtime->assignVarToTop(*parasCursor, *parasDataCursor);
        parasCursor++;
        parasDataCursor++;
    }
    auto bracketsCursor = body.begin();
    while (bracketsCursor != (--body.end())) {
        result = (*bracketsCursor)->eval(runtime);
        Data::check(result);
        bracketsCursor++;
    }
    result = (*bracketsCursor)->eval(runtime);
    for (auto &i: *parasData) {
        Data::check(i);
    }
    delete parasData;
    delete runtime;
    return result;
}